

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

AllocResult<kj::_::BTreeImpl::Parent> __thiscall
kj::_::BTreeImpl::alloc<kj::_::BTreeImpl::Parent>(BTreeImpl *this)

{
  AllocResult<kj::_::BTreeImpl::Parent> AVar1;
  
  AVar1._0_8_ = CONCAT44(0,this->freelistHead);
  this->freelistHead = this->tree[AVar1._0_8_].field_0.freelist.nextOffset + this->freelistHead + 1;
  this->freelistSize = this->freelistSize - 1;
  AVar1.node = (Parent *)(this->tree + AVar1._0_8_);
  return AVar1;
}

Assistant:

inline BTreeImpl::AllocResult<T> BTreeImpl::alloc() {
  // Allocate a new item from the freelist. Guaranteed to be zero'd except for the first member.
  uint i = freelistHead;
  NodeUnion* ptr = &tree[i];
  freelistHead = i + 1 + ptr->freelist.nextOffset;
  --freelistSize;
  return { i, *ptr };
}